

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void lua_settop(lua_State *L,int idx)

{
  StkId pTVar1;
  int idx_local;
  lua_State *L_local;
  
  if (idx < 0) {
    L->top = L->top + (idx + 1);
  }
  else {
    while (L->top < L->base + idx) {
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pTVar1->tt = 0;
    }
    L->top = L->base + idx;
  }
  return;
}

Assistant:

static void lua_settop(lua_State*L,int idx){
if(idx>=0){
luai_apicheck(L,idx<=L->stack_last-L->base);
while(L->top<L->base+idx)
setnilvalue(L->top++);
L->top=L->base+idx;
}
else{
luai_apicheck(L,-(idx+1)<=(L->top-L->base));
L->top+=idx+1;
}
}